

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void set_player_palette(dw_rom *rom,uint8_t palette)

{
  ushort local_16;
  ushort local_14;
  uint16_t address;
  uint16_t base;
  uint8_t palette_local;
  dw_rom *rom_local;
  
  if (palette < 4) {
    for (local_14 = 0x13b5; local_14 < 0x16b6; local_14 = local_14 + 0x100) {
      for (local_16 = local_14; (uint)local_16 <= local_14 + 0x4e; local_16 = local_16 + 2) {
        if ((rom->content[local_16] & 3) == 0) {
          rom->content[local_16] = rom->content[local_16] | palette;
        }
      }
    }
  }
  else {
    printf("Improper palette number of %d, ignoring.\n",(ulong)palette);
  }
  return;
}

Assistant:

static void set_player_palette(dw_rom *rom, uint8_t palette)
{
    uint16_t base, address;

    if (palette > 3) {
        printf("Improper palette number of %d, ignoring.\n", palette);
        return;
    }
    for (base = 0x13b5; base <= 0x16b5; base += 0x100) {
        for (address = base; address <= base + 0x4e; address += 2) {
            if (!(rom->content[address] & 0x03))
                rom->content[address] |= palette;
        }
    }
}